

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGroup.c
# Opt level: O3

int ddGroupSiftingAux(DdManager *table,int x,int xLow,int xHigh,DD_CHKFP checkFunction,int lazyFlag)

{
  DdSubtable *pDVar1;
  uint uVar2;
  uint uVar3;
  uint size;
  int iVar4;
  int iVar5;
  DdNode *pDVar6;
  DdNode *pDVar7;
  DdNode *pDVar8;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  DdNode *local_38;
  
  size = table->keys - table->isolated;
  local_38 = (DdNode *)0x0;
  originalSize = size;
  if (table->subtables[x].next == x) {
    uVar10 = x;
    if (xLow < x) {
      do {
        iVar5 = uVar10 - 1;
        iVar4 = (*checkFunction)(table,iVar5,uVar10);
        if (iVar4 == 0) break;
        pDVar1 = table->subtables;
        uVar9 = pDVar1[iVar5].next;
        pDVar1[iVar5].next = uVar10;
        pDVar1[x].next = uVar9;
        uVar10 = uVar9;
      } while (xLow < (int)uVar9);
    }
    uVar10 = x;
    if (x < xHigh) {
      do {
        uVar9 = uVar10 + 1;
        iVar5 = (*checkFunction)(table,uVar10,uVar9);
        if (iVar5 == 0) break;
        pDVar1 = table->subtables;
        uVar3 = uVar9;
        do {
          uVar2 = uVar3;
          uVar3 = pDVar1[(int)uVar2].next;
        } while (uVar2 < pDVar1[(int)uVar2].next);
        pDVar1[(int)uVar2].next = pDVar1[(int)uVar10].next;
        pDVar1[(int)uVar10].next = uVar9;
        uVar10 = uVar2;
      } while ((int)uVar2 < xHigh);
    }
  }
  do {
    uVar10 = x;
    x = table->subtables[(int)uVar10].next;
  } while (uVar10 < (uint)x);
  if (uVar10 == xLow) {
    if (xLow == xHigh) {
      return 1;
    }
LAB_00930314:
    iVar5 = ddGroupSiftingDown(table,xLow,xHigh,checkFunction,(Move **)&local_38);
    if (iVar5 == 0) goto LAB_0093036f;
    iVar5 = 0;
LAB_00930334:
    pDVar7 = local_38;
    iVar5 = ddGroupSiftingBackward(table,(Move *)local_38,size,iVar5,lazyFlag);
    local_38 = pDVar7;
    if (iVar5 != 0) {
      iVar5 = 1;
      if (pDVar7 == (DdNode *)0x0) {
        return 1;
      }
      pDVar6 = table->nextFree;
      do {
        pDVar8 = pDVar7;
        pDVar7 = (pDVar8->type).kids.T;
        pDVar8->ref = 0;
        pDVar8->next = pDVar6;
        pDVar6 = pDVar8;
      } while (pDVar7 != (DdNode *)0x0);
      goto LAB_00930397;
    }
  }
  else {
    iVar5 = cuddNextHigh(table,uVar10);
    if (xHigh < iVar5) {
      uVar9 = table->subtables[(int)uVar10].next;
LAB_0093028b:
      iVar5 = ddGroupSiftingUp(table,uVar9,xLow,checkFunction,(Move **)&local_38);
      if (iVar5 != 0) {
        iVar5 = 1;
        goto LAB_00930334;
      }
    }
    else if ((int)(xHigh - uVar10) < (int)(uVar10 - xLow)) {
      iVar5 = ddGroupSiftingDown(table,uVar10,xHigh,checkFunction,(Move **)&local_38);
      if (iVar5 != 0) {
        if (local_38 != (DdNode *)0x0) {
          uVar10 = local_38->ref;
        }
        do {
          uVar9 = table->subtables[(int)uVar10].next;
          bVar11 = uVar10 < uVar9;
          uVar10 = uVar9;
        } while (bVar11);
        goto LAB_0093028b;
      }
    }
    else {
      uVar10 = table->subtables[(int)uVar10].next;
      iVar5 = ddGroupSiftingUp(table,uVar10,xLow,checkFunction,(Move **)&local_38);
      if (iVar5 != 0) {
        if (local_38 != (DdNode *)0x0) {
          uVar10 = local_38->index;
        }
        do {
          xLow = uVar10;
          uVar10 = table->subtables[xLow].next;
        } while ((uint)xLow < uVar10);
        goto LAB_00930314;
      }
    }
  }
LAB_0093036f:
  iVar5 = 0;
  if (local_38 == (DdNode *)0x0) {
    return 0;
  }
  pDVar7 = table->nextFree;
  do {
    pDVar8 = local_38;
    local_38 = (pDVar8->type).kids.T;
    pDVar8->ref = 0;
    pDVar8->next = pDVar7;
    pDVar7 = pDVar8;
  } while (local_38 != (DdNode *)0x0);
LAB_00930397:
  table->nextFree = pDVar8;
  return iVar5;
}

Assistant:

static int
ddGroupSiftingAux(
  DdManager * table,
  int  x,
  int  xLow,
  int  xHigh,
  DD_CHKFP checkFunction,
  int lazyFlag)
{
    Move *move;
    Move *moves;        /* list of moves */
    int  initialSize;
    int  result;
    int  y;
    int  topbot;

#ifdef DD_DEBUG
    if (pr > 0) (void) fprintf(table->out,
                               "ddGroupSiftingAux from %d to %d\n",xLow,xHigh);
    assert((unsigned) x >= table->subtables[x].next); /* x is bottom of group */
#endif

    initialSize = table->keys - table->isolated;
    moves = NULL;

    originalSize = initialSize;         /* for lazy sifting */

    /* If we have a singleton, we check for aggregation in both
    ** directions before we sift.
    */
    if ((unsigned) x == table->subtables[x].next) {
        /* Will go down first, unless x == xHigh:
        ** Look for aggregation above x.
        */
        for (y = x; y > xLow; y--) {
            if (!checkFunction(table,y-1,y))
                break;
            topbot = table->subtables[y-1].next; /* find top of y-1's group */
            table->subtables[y-1].next = y;
            table->subtables[x].next = topbot; /* x is bottom of group so its */
                                               /* next is top of y-1's group */
            y = topbot + 1; /* add 1 for y--; new y is top of group */
        }
        /* Will go up first unless x == xlow:
        ** Look for aggregation below x.
        */
        for (y = x; y < xHigh; y++) {
            if (!checkFunction(table,y,y+1))
                break;
            /* find bottom of y+1's group */
            topbot = y + 1;
            while ((unsigned) topbot < table->subtables[topbot].next) {
                topbot = table->subtables[topbot].next;
            }
            table->subtables[topbot].next = table->subtables[y].next;
            table->subtables[y].next = y + 1;
            y = topbot - 1; /* subtract 1 for y++; new y is bottom of group */
        }
    }

    /* Now x may be in the middle of a group.
    ** Find bottom of x's group.
    */
    while ((unsigned) x < table->subtables[x].next)
        x = table->subtables[x].next;

    if (x == xLow) { /* Sift down */
#ifdef DD_DEBUG
        /* x must be a singleton */
        assert((unsigned) x == table->subtables[x].next);
#endif
        if (x == xHigh) return(1);      /* just one variable */

        if (!ddGroupSiftingDown(table,x,xHigh,checkFunction,&moves))
            goto ddGroupSiftingAuxOutOfMem;
        /* at this point x == xHigh, unless early term */

        /* move backward and stop at best position */
        result = ddGroupSiftingBackward(table,moves,initialSize,
                                        DD_SIFT_DOWN,lazyFlag);
#ifdef DD_DEBUG
        assert(table->keys - table->isolated <= (unsigned) initialSize);
#endif
        if (!result) goto ddGroupSiftingAuxOutOfMem;

    } else if (cuddNextHigh(table,x) > xHigh) { /* Sift up */
#ifdef DD_DEBUG
        /* x is bottom of group */
        assert((unsigned) x >= table->subtables[x].next);
#endif
        /* Find top of x's group */
        x = table->subtables[x].next;

        if (!ddGroupSiftingUp(table,x,xLow,checkFunction,&moves))
            goto ddGroupSiftingAuxOutOfMem;
        /* at this point x == xLow, unless early term */

        /* move backward and stop at best position */
        result = ddGroupSiftingBackward(table,moves,initialSize,
                                        DD_SIFT_UP,lazyFlag);
#ifdef DD_DEBUG
        assert(table->keys - table->isolated <= (unsigned) initialSize);
#endif
        if (!result) goto ddGroupSiftingAuxOutOfMem;

    } else if (x - xLow > xHigh - x) { /* must go down first: shorter */
        if (!ddGroupSiftingDown(table,x,xHigh,checkFunction,&moves))
            goto ddGroupSiftingAuxOutOfMem;
        /* at this point x == xHigh, unless early term */

        /* Find top of group */
        if (moves) {
            x = moves->y;
        }
        while ((unsigned) x < table->subtables[x].next)
            x = table->subtables[x].next;
        x = table->subtables[x].next;
#ifdef DD_DEBUG
        /* x should be the top of a group */
        assert((unsigned) x <= table->subtables[x].next);
#endif

        if (!ddGroupSiftingUp(table,x,xLow,checkFunction,&moves))
            goto ddGroupSiftingAuxOutOfMem;

        /* move backward and stop at best position */
        result = ddGroupSiftingBackward(table,moves,initialSize,
                                        DD_SIFT_UP,lazyFlag);
#ifdef DD_DEBUG
        assert(table->keys - table->isolated <= (unsigned) initialSize);
#endif
        if (!result) goto ddGroupSiftingAuxOutOfMem;

    } else { /* moving up first: shorter */
        /* Find top of x's group */
        x = table->subtables[x].next;

        if (!ddGroupSiftingUp(table,x,xLow,checkFunction,&moves))
            goto ddGroupSiftingAuxOutOfMem;
        /* at this point x == xHigh, unless early term */

        if (moves) {
            x = moves->x;
        }
        while ((unsigned) x < table->subtables[x].next)
            x = table->subtables[x].next;
#ifdef DD_DEBUG
        /* x is bottom of a group */
        assert((unsigned) x >= table->subtables[x].next);
#endif

        if (!ddGroupSiftingDown(table,x,xHigh,checkFunction,&moves))
            goto ddGroupSiftingAuxOutOfMem;

        /* move backward and stop at best position */
        result = ddGroupSiftingBackward(table,moves,initialSize,
                                        DD_SIFT_DOWN,lazyFlag);
#ifdef DD_DEBUG
        assert(table->keys - table->isolated <= (unsigned) initialSize);
#endif
        if (!result) goto ddGroupSiftingAuxOutOfMem;
    }

    while (moves != NULL) {
        move = moves->next;
        cuddDeallocMove(table, moves);
        moves = move;
    }

    return(1);

ddGroupSiftingAuxOutOfMem:
    while (moves != NULL) {
        move = moves->next;
        cuddDeallocMove(table, moves);
        moves = move;
    }

    return(0);

}